

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# recycle.c
# Opt level: O3

OBJ_APPLY_DATA * new_apply_data(void)

{
  OBJ_APPLY_DATA *pOVar1;
  
  if (apply_free == (OBJ_APPLY_DATA *)0x0) {
    pOVar1 = (OBJ_APPLY_DATA *)operator_new(0x10);
  }
  else {
    pOVar1 = apply_free;
    apply_free = apply_free->next;
  }
  pOVar1->valid = false;
  pOVar1->field_0x1 = 0;
  pOVar1->location = 0;
  pOVar1->modifier = 0;
  pOVar1->type = 0;
  pOVar1->next = (OBJ_APPLY_DATA *)0x0;
  pOVar1->valid = true;
  return pOVar1;
}

Assistant:

OBJ_APPLY_DATA *new_apply_data(void)
{
	static OBJ_APPLY_DATA app_zero;
	OBJ_APPLY_DATA *app;

	if (apply_free == nullptr)
	{
		app = new OBJ_APPLY_DATA;
	}
	else
	{
		app = apply_free;
		apply_free = apply_free->next;
	}

	*app = app_zero;
	app->type = 0;

	app->valid = true;
	return app;
}